

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_InCaselessSetWithDefault_Test::TestBody(TApp_InCaselessSetWithDefault_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  AssertHelper local_270;
  Message local_268 [2];
  ConversionError *anon_var_0;
  char *pcStack_250;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218 [32];
  iterator local_1f8;
  size_type local_1f0;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198 [32];
  iterator local_178;
  size_type local_170;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  string local_140;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11d;
  undefined1 local_11c;
  allocator local_11b;
  allocator local_11a;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  string local_d0 [32];
  iterator local_b0;
  size_type local_a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  allocator local_69;
  string local_68;
  allocator local_31;
  undefined1 local_30 [8];
  string choice;
  TApp_InCaselessSetWithDefault_Test *this_local;
  
  choice.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"one",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"-q,--quick",&local_69);
  local_11c = 1;
  local_118 = &local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"one",&local_119);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"two",&local_11a);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"three",&local_11b);
  local_11c = 0;
  local_b0 = &local_110;
  local_a8 = 3;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_11e);
  __l_01._M_len = local_a8;
  __l_01._M_array = local_b0;
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_a0,__l_01,&local_11d,&local_11e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  CLI::App::add_set_ignore_case
            (&(this->super_TApp).app,&local_68,(string *)local_30,&local_a0,&local_140,true);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_a0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_11e);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  do {
    local_2d8 = local_2d8 + -1;
    std::__cxx11::string::~string((string *)local_2d8);
  } while (local_2d8 != &local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_11b);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_158,"\"one\"","choice",(char (*) [4])0x1cda88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x340,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_1.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"--quick",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"tWo",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 6));
  gtest_ar_1.message_.ptr_._5_1_ = 0;
  local_178 = &local_1b8;
  local_170 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_178;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_348 = local_348 + -1;
    std::__cxx11::string::~string((string *)local_348);
  } while (local_348 != &local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((EqHelper<false> *)local_1d8,"\"two\"","choice",(char (*) [4])0x1cd581,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x346,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_238,"--quick",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"four",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_1f8 = &local_238;
  local_1f0 = 2;
  __l._M_len = 2;
  __l._M_array = local_1f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8;
  do {
    local_3b8 = local_3b8 + -1;
    std::__cxx11::string::~string((string *)local_3b8);
  } while (local_3b8 != &local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdb0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdb0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0013d951;
    pcStack_250 = 
    "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_268);
  testing::internal::AssertHelper::AssertHelper
            (&local_270,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x34b,pcStack_250);
  testing::internal::AssertHelper::operator=(&local_270,local_268);
  testing::internal::AssertHelper::~AssertHelper(&local_270);
  testing::Message::~Message(local_268);
LAB_0013d951:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, InCaselessSetWithDefault) {

    std::string choice = "one";
    app.add_set_ignore_case("-q,--quick", choice, {"one", "two", "three"}, "", true);

    run();
    EXPECT_EQ("one", choice);
    app.reset();

    args = {"--quick", "tWo"};

    run();
    EXPECT_EQ("two", choice);

    app.reset();

    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);
}